

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char[2],char[42],bool,char[2],char[43],bool,char[2],char[37],bool,char[2],char[34],bool,char[2]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [2],
                   char (*args_1) [42],bool *args_2,char (*args_3) [2],char (*args_4) [43],
                   bool *args_5,char (*args_6) [2],char (*args_7) [37],bool *args_8,
                   char (*args_9) [2],char (*args_10) [34],bool *args_11,char (*args_12) [2])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_1e0;
  cmAlphaNum local_1b0;
  cmAlphaNum local_180;
  cmAlphaNum local_150;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  size_t local_110;
  char *pcStack_108;
  size_t local_100;
  char (*local_f8) [2];
  size_t local_f0;
  char (*local_e8) [42];
  size_t local_e0;
  char *pcStack_d8;
  size_t local_d0;
  char (*local_c8) [2];
  size_t local_c0;
  char (*local_b8) [43];
  size_t local_b0;
  char *pcStack_a8;
  size_t local_a0;
  char (*local_98) [2];
  size_t local_90;
  char (*local_88) [37];
  size_t local_80;
  char *pcStack_78;
  size_t local_70;
  char (*local_68) [2];
  size_t local_60;
  char (*local_58) [34];
  size_t local_50;
  char *pcStack_48;
  size_t local_40;
  char (*local_38) [2];
  
  local_120._M_len = (a->View_)._M_len;
  local_120._M_str = (a->View_)._M_str;
  local_110 = (b->View_)._M_len;
  pcStack_108 = (b->View_)._M_str;
  local_100 = strlen(*args);
  local_f8 = args;
  local_f0 = strlen(*args_1);
  local_e8 = args_1;
  cmAlphaNum::cmAlphaNum(&local_150,(uint)*args_2);
  local_e0 = local_150.View_._M_len;
  pcStack_d8 = local_150.View_._M_str;
  local_d0 = strlen(*args_3);
  local_c8 = args_3;
  local_c0 = strlen(*args_4);
  local_b8 = args_4;
  cmAlphaNum::cmAlphaNum(&local_180,(uint)*args_5);
  local_b0 = local_180.View_._M_len;
  pcStack_a8 = local_180.View_._M_str;
  local_a0 = strlen(*args_6);
  local_98 = args_6;
  local_90 = strlen(*args_7);
  local_88 = args_7;
  cmAlphaNum::cmAlphaNum(&local_1b0,(uint)*args_8);
  local_80 = local_1b0.View_._M_len;
  pcStack_78 = local_1b0.View_._M_str;
  local_70 = strlen(*args_9);
  local_68 = args_9;
  local_60 = strlen(*args_10);
  local_58 = args_10;
  cmAlphaNum::cmAlphaNum(&local_1e0,(uint)*args_11);
  local_50 = local_1e0.View_._M_len;
  pcStack_48 = local_1e0.View_._M_str;
  local_40 = strlen(*args_12);
  local_38 = args_12;
  views._M_len = 0xf;
  views._M_array = &local_120;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}